

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_solver.cc
# Opt level: O3

void __thiscall ipx::LpSolver::RunInitialIPM(LpSolver *this,IPM *ipm)

{
  int iVar1;
  int iVar2;
  ipxint *piVar3;
  double dVar4;
  Timer timer;
  KKTSolverDiag kkt;
  Timer TStack_c8;
  KKTSolverDiag local_c0;
  
  Timer::Timer(&TStack_c8);
  KKTSolverDiag::KKTSolverDiag(&local_c0,&this->control_,&this->model_);
  iVar2 = (this->control_).parameters_.super_ipx_parameters.switchiter;
  if (iVar2 < 0) {
    local_c0.maxiter_ = (this->model_).num_rows_ / 0x14;
    if (0x1e9 < local_c0.maxiter_) {
      local_c0.maxiter_ = 0x1ea;
    }
    local_c0.maxiter_ = local_c0.maxiter_ + 10;
    iVar2 = (this->control_).parameters_.super_ipx_parameters.ipm_maxiter;
  }
  else {
    iVar1 = (this->control_).parameters_.super_ipx_parameters.ipm_maxiter;
    if (iVar1 < iVar2) {
      iVar2 = iVar1;
    }
  }
  ipm->maxiter_ = iVar2;
  IPM::Driver(ipm,&local_c0.super_KKTSolver,
              (this->iterate_)._M_t.
              super___uniq_ptr_impl<ipx::Iterate,_std::default_delete<ipx::Iterate>_>._M_t.
              super__Tuple_impl<0UL,_ipx::Iterate_*,_std::default_delete<ipx::Iterate>_>.
              super__Head_base<0UL,_ipx::Iterate_*,_false>._M_head_impl,&this->info_);
  iVar2 = (this->info_).super_ipx_info.status_ipm;
  if (iVar2 - 1U < 9) {
    piVar3 = &(this->info_).super_ipx_info.status_ipm;
    switch(iVar2) {
    case 1:
    case 8:
      break;
    default:
      goto switchD_003a3eb9_caseD_2;
    case 7:
      if ((this->control_).parameters_.super_ipx_parameters.ipm_maxiter <=
          (this->info_).super_ipx_info.iter) goto switchD_003a3eb9_caseD_2;
      break;
    case 9:
      (this->info_).super_ipx_info.status_ipm = 0;
      piVar3 = &(this->info_).super_ipx_info.errflag;
    }
    *piVar3 = 0;
  }
switchD_003a3eb9_caseD_2:
  dVar4 = Timer::Elapsed(&TStack_c8);
  (this->info_).super_ipx_info.time_ipm1 = dVar4 + (this->info_).super_ipx_info.time_ipm1;
  local_c0.super_KKTSolver._vptr_KKTSolver = (_func_int **)&PTR__KKTSolverDiag_00441988;
  operator_delete(local_c0.resscale_._M_data);
  operator_delete(local_c0.W_._M_data);
  local_c0.precond_.super_LinearOperator._vptr_LinearOperator =
       (_func_int **)&PTR__DiagonalPrecond_00441830;
  operator_delete(local_c0.precond_.diagonal_._M_data);
  local_c0.normal_matrix_.super_LinearOperator._vptr_LinearOperator =
       (_func_int **)&PTR__NormalMatrix_004419e8;
  operator_delete(local_c0.normal_matrix_.work_._M_data);
  return;
}

Assistant:

void LpSolver::RunInitialIPM(IPM& ipm) {
    Timer timer;
    KKTSolverDiag kkt(control_, model_);

    Int switchiter = control_.switchiter();
    if (switchiter < 0) {
        // Switch iteration not specified by user. Run as long as KKT solver
        // converges within min(500,10+m/20) iterations.
        Int m = model_.rows();
        kkt.maxiter(std::min(500l, (long) (10+m/20) ));
        ipm.maxiter(control_.ipm_maxiter());
    } else {
        ipm.maxiter(std::min(switchiter, control_.ipm_maxiter()));
    }
    ipm.Driver(&kkt, iterate_.get(), &info_);
    switch (info_.status_ipm) {
    case IPX_STATUS_optimal:
        // If the IPM reached its termination criterion in the initial
        // iterations (happens rarely), we still call the IPM again with basis
        // preconditioning. In exact arithmetic it would terminate without an
        // additional iteration. A starting basis is then available for
        // crossover.
        info_.status_ipm = IPX_STATUS_not_run;
        break;
    case IPX_STATUS_no_progress:
        info_.status_ipm = IPX_STATUS_not_run;
        break;
    case IPX_STATUS_failed:
        info_.status_ipm = IPX_STATUS_not_run;
        info_.errflag = 0;
        break;
    case IPX_STATUS_iter_limit:
        if (info_.iter < control_.ipm_maxiter()) // stopped at switchiter
            info_.status_ipm = IPX_STATUS_not_run;
    }
    info_.time_ipm1 += timer.Elapsed();
}